

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autogenerated_settings.cpp
# Opt level: O3

void duckdb::ExtensionDirectorySetting::SetGlobal
               (DatabaseInstance *db,DBConfig *config,Value *input)

{
  string local_30;
  
  Value::GetValue<std::__cxx11::string>(&local_30,input);
  ::std::__cxx11::string::operator=
            ((string *)&(config->options).extension_directory,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ExtensionDirectorySetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	config.options.extension_directory = input.GetValue<string>();
}